

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O0

bool gerr::IsCode<gerr::details::IError,void>(int code,shared_ptr<gerr::details::IError> *err)

{
  bool bVar1;
  shared_ptr<gerr::details::IError> local_28;
  shared_ptr<gerr::details::IError> *local_18;
  shared_ptr<gerr::details::IError> *err_local;
  int code_local;
  
  local_18 = err;
  err_local._4_4_ = code;
  AsCode<gerr::details::IError,void>((gerr *)&local_28,code,err);
  bVar1 = std::operator!=(&local_28,(nullptr_t)0x0);
  std::shared_ptr<gerr::details::IError>::~shared_ptr(&local_28);
  return bVar1;
}

Assistant:

bool IsCode(int code, std::shared_ptr<ErrType> const& err) {
  return AsCode(code, err) != nullptr;
}